

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QConfFileCustomFormat>::reallocate
          (QMovableArrayOps<QConfFileCustomFormat> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QConfFileCustomFormat>_*,_QConfFileCustomFormat_*> pVar1;
  
  pVar1 = QTypedArrayData<QConfFileCustomFormat>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QConfFileCustomFormat>).
                     super_QArrayDataPointer<QConfFileCustomFormat>.d,
                     (this->super_QGenericArrayOps<QConfFileCustomFormat>).
                     super_QArrayDataPointer<QConfFileCustomFormat>.ptr,alloc,option);
  if (pVar1.second != (QConfFileCustomFormat *)0x0) {
    (this->super_QGenericArrayOps<QConfFileCustomFormat>).
    super_QArrayDataPointer<QConfFileCustomFormat>.d = pVar1.first;
    (this->super_QGenericArrayOps<QConfFileCustomFormat>).
    super_QArrayDataPointer<QConfFileCustomFormat>.ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }